

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::SetColumnWidth(int column_index,float width)

{
  float fVar1;
  
  if (column_index < 0) {
    column_index = ((GImGui->CurrentWindow->DC).CurrentColumns)->Current;
  }
  fVar1 = GetColumnOffset(column_index);
  SetColumnOffset(column_index + 1,fVar1 + width);
  return;
}

Assistant:

void ImGui::SetColumnWidth(int column_index, float width)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    SetColumnOffset(column_index + 1, GetColumnOffset(column_index) + width);
}